

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<unsigned_int>::Matcher(Matcher<unsigned_int> *this,uint value)

{
  uint local_2c;
  MatcherBase<unsigned_int> local_28;
  
  (this->super_MatcherBase<unsigned_int>).impl_.value_ = (MatcherInterface<unsigned_int> *)0x0;
  (this->super_MatcherBase<unsigned_int>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_int>).impl_.link_;
  (this->super_MatcherBase<unsigned_int>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b81c8;
  local_2c = value;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<unsigned_int> *)&local_28,(EqMatcher *)&local_2c);
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::operator=
            (&(this->super_MatcherBase<unsigned_int>).impl_,&local_28.impl_);
  internal::MatcherBase<unsigned_int>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }